

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_limit.cpp
# Opt level: O2

void __thiscall rate_limit::handle_connected(rate_limit *this,tcp_connection *conn)

{
  ostream *poVar1;
  endpoint ep;
  endpoint local_18 [16];
  
  local_18 = (endpoint  [16])ranger::event::tcp_connection::remote_endpoint();
  poVar1 = std::operator<<((ostream *)&std::cout,"connection[");
  poVar1 = ranger::event::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,"] connected.");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void handle_connected(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cout << "connection[" << ep << "] connected." << std::endl;
	}